

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O1

bool __thiscall
ServerService::sendSegments
          (ServerService *this,byte *data,int socketFD,sockaddr_storage clientDetails,
          int recvWindowSize)

{
  double dVar1;
  undefined8 uVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  _Elt_pointer ppSVar10;
  _Map_pointer pppSVar11;
  _Map_pointer pppSVar12;
  int iVar13;
  byte4 bVar14;
  byte *pbVar15;
  SendUnit *pSVar16;
  Congestion *this_00;
  long *plVar17;
  ostream *poVar18;
  Sliding *pSVar19;
  ServerSegment *rudp;
  byte *pbVar20;
  int *piVar21;
  char *pcVar22;
  long lVar23;
  _Elt_pointer ppSVar24;
  ulong uVar25;
  sockaddr_storage *psVar26;
  Sliding **ppSVar27;
  ServerService *this_01;
  sockaddr *psVar28;
  long lVar29;
  _Elt_pointer ppSVar30;
  ulong uVar31;
  _Map_pointer pppSVar32;
  _Map_pointer pppSVar33;
  ulong uVar34;
  byte bVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  deque<Sliding_*,_std::allocator<Sliding_*>_> window;
  timeval timeValue;
  fd_set readFDs;
  timespec start;
  sockaddr_storage in_stack_fffffffffffffcd8;
  byte4 local_29c;
  ulong local_298;
  _Deque_base<Sliding_*,_std::allocator<Sliding_*>_> local_288;
  byte *local_230;
  _Map_pointer local_228;
  _Elt_pointer local_220;
  _Map_pointer local_218;
  ulong local_210;
  timeval local_208;
  ulong local_1f8;
  ulong local_1f0;
  int local_1e4;
  SendUnit *local_1e0;
  _Elt_pointer local_1d8;
  long local_1d0;
  ulong local_1c8;
  double local_1c0;
  fd_set local_1b8;
  sockaddr local_130 [8];
  Sliding *local_b0 [16];
  
  bVar35 = 0;
  pppSVar32 = (_Map_pointer)(ulong)(uint)socketFD;
  iVar13 = rand();
  pbVar15 = (byte *)calloc(0x5c0,1);
  memset(pbVar15,0,0x5c0);
  pSVar16 = (SendUnit *)operator_new(0x20);
  SendUnit::SendUnit(pSVar16,iVar13 % 100,data);
  local_230 = pbVar15;
  local_1f8 = (ulong)(uint)(iVar13 % 100);
  local_1e0 = pSVar16;
  this_00 = (Congestion *)operator_new(0x38);
  local_1f0 = CONCAT44(local_1f0._4_4_,recvWindowSize);
  Congestion::Congestion(this_00,recvWindowSize);
  local_1b8.fds_bits[0xe] = 0;
  local_1b8.fds_bits[0xf] = 0;
  local_1b8.fds_bits[0xc] = 0;
  local_1b8.fds_bits[0xd] = 0;
  local_1b8.fds_bits[10] = 0;
  local_1b8.fds_bits[0xb] = 0;
  local_1b8.fds_bits[8] = 0;
  local_1b8.fds_bits[9] = 0;
  local_1b8.fds_bits[6] = 0;
  local_1b8.fds_bits[7] = 0;
  local_1b8.fds_bits[4] = 0;
  local_1b8.fds_bits[5] = 0;
  local_1b8.fds_bits[2] = 0;
  local_1b8.fds_bits[3] = 0;
  local_1b8.fds_bits[0] = 0;
  local_1b8.fds_bits[1] = 0;
  iVar13 = socketFD + 0x3f;
  if (-1 < socketFD) {
    iVar13 = socketFD;
  }
  local_1c8 = 1L << ((byte)socketFD & 0x3f);
  local_1d0 = (long)(iVar13 >> 6);
  local_1b8.fds_bits[local_1d0] = local_1b8.fds_bits[local_1d0] | local_1c8;
  local_208.tv_sec = 0;
  local_208.tv_usec = 50000;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_218 = pppSVar32;
  std::_Deque_base<Sliding_*,_std::allocator<Sliding_*>_>::_M_initialize_map(&local_288,0);
  pppSVar12 = local_288._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppSVar11 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
  ppSVar10 = local_288._M_impl.super__Deque_impl_data._M_start._M_last;
  ppSVar30 = local_288._M_impl.super__Deque_impl_data._M_start._M_first;
  ppSVar24 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
  pppSVar33 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar15 = local_230;
  local_210 = local_1f8;
  while (local_230 = pbVar15, local_1f8 = local_210, pppSVar33 < pppSVar12) {
    operator_delete(pppSVar33[1],0x200);
    pppSVar32 = pppSVar33 + 1;
    pbVar15 = local_230;
    local_210 = local_1f8;
    pppSVar33 = pppSVar32;
  }
  local_1e4 = (int)local_218 + 1;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = ppSVar24;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_first = ppSVar30;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_last = ppSVar10;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_node = pppSVar11;
  local_1c0 = (double)(int)local_1f0;
  local_29c = (byte4)local_210;
  local_1f0 = (ulong)-local_29c;
  do {
    uVar36 = SUB84(local_1c0,0);
    uVar37 = (undefined4)((ulong)local_1c0 >> 0x20);
    dVar1 = this_00->cwnd;
    if (dVar1 <= local_1c0) {
      uVar36 = SUB84(dVar1,0);
      uVar37 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    iVar13 = (int)(double)CONCAT44(uVar37,uVar36);
    if (this_00->isSlowStart == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sending Packets in mode: Slow Start",0x23);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Maximum Packets that will be sent:",0x22);
      plVar17 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
      std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sending Packets in mode: Congestion Avoidance",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Maximum Packets that will be sent:",0x22);
      plVar17 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
      std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
    }
    std::ostream::put((char)plVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"RetransmissionTime-Out: ",0x18);
    poVar18 = std::ostream::_M_insert<double>(this_00->RTO);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    pppSVar11 = local_288._M_impl.super__Deque_impl_data._M_finish._M_node;
    pppSVar33 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
    ppSVar30 = local_288._M_impl.super__Deque_impl_data._M_start._M_last;
    ppSVar24 = local_288._M_impl.super__Deque_impl_data._M_start._M_first;
    local_228 = pppSVar32;
    local_220 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar34 = local_210;
    pSVar16 = local_1e0;
    for (pppSVar32 = local_288._M_impl.super__Deque_impl_data._M_start._M_node; local_230 = pbVar15,
        local_210 = uVar34, local_1e0 = pSVar16, pppSVar32 < pppSVar11; pppSVar32 = pppSVar32 + 1) {
      operator_delete(pppSVar32[1],0x200);
      pbVar15 = local_230;
      uVar34 = local_210;
      pSVar16 = local_1e0;
    }
    local_288._M_impl.super__Deque_impl_data._M_finish._M_first = ppSVar24;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_last = ppSVar30;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_node = pppSVar33;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = local_220;
    if (iVar13 != 0) {
      bVar14 = (byte4)uVar34;
      if ((ulong)(bVar14 - (int)local_1f8) < pSVar16->dataSize) {
        do {
          uVar3 = bVar14 + 0x5b0;
          uVar34 = (ulong)uVar3;
          pbVar15 = SendUnit::getSendUnit(pSVar16,bVar14);
          psVar26 = &clientDetails;
          psVar28 = local_130;
          for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
            cVar4 = psVar26->__ss_padding[0];
            cVar5 = psVar26->__ss_padding[1];
            cVar6 = psVar26->__ss_padding[2];
            cVar7 = psVar26->__ss_padding[3];
            cVar8 = psVar26->__ss_padding[4];
            cVar9 = psVar26->__ss_padding[5];
            psVar28->sa_family = psVar26->ss_family;
            psVar28->sa_data[0] = cVar4;
            psVar28->sa_data[1] = cVar5;
            psVar28->sa_data[2] = cVar6;
            psVar28->sa_data[3] = cVar7;
            psVar28->sa_data[4] = cVar8;
            psVar28->sa_data[5] = cVar9;
            psVar26 = (sockaddr_storage *)((long)psVar26 + (ulong)bVar35 * -0x10 + 8);
            psVar28 = (sockaddr *)(psVar28[-(ulong)bVar35].sa_data + 6);
          }
          sendto((int)local_218,pbVar15,0x5c0,0,local_130,0x80);
          pSVar19 = (Sliding *)operator_new(0x18);
          rudp = SendUnit::getRUDP(pSVar16,bVar14);
          clock_gettime(1,(timespec *)local_130);
          Sliding::Sliding(pSVar19,rudp,
                           (double)((long)local_130[0].sa_data._6_8_ / 1000000000 +
                                   local_130[0]._0_8_));
          local_b0[0] = pSVar19;
          if (local_288._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_288._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Sliding*,std::allocator<Sliding*>>::_M_push_back_aux<Sliding*>
                      ((deque<Sliding*,std::allocator<Sliding*>> *)&local_288,local_b0);
          }
          else {
            *local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = pSVar19;
            local_288._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_288._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          iVar13 = iVar13 + -1;
        } while ((iVar13 != 0) &&
                (bVar14 = uVar3, (ulong)((int)local_1f0 + uVar3) < pSVar16->dataSize));
      }
    }
    local_1b8.fds_bits[0] = 0;
    local_1b8.fds_bits[1] = 0;
    local_1b8.fds_bits[2] = 0;
    local_1b8.fds_bits[3] = 0;
    local_1b8.fds_bits[4] = 0;
    local_1b8.fds_bits[5] = 0;
    local_1b8.fds_bits[6] = 0;
    local_1b8.fds_bits[7] = 0;
    local_1b8.fds_bits[8] = 0;
    local_1b8.fds_bits[9] = 0;
    local_1b8.fds_bits[10] = 0;
    local_1b8.fds_bits[0xb] = 0;
    local_1b8.fds_bits[0xc] = 0;
    local_1b8.fds_bits[0xd] = 0;
    local_1b8.fds_bits[0xe] = 0;
    local_1b8.fds_bits[0xf] = 0;
    local_1b8.fds_bits[local_1d0] = local_1b8.fds_bits[local_1d0] | local_1c8;
    if ((local_208.tv_usec != 0) && (local_208.tv_sec != 0)) {
      local_208.tv_sec = (long)this_00->RTO / 1000000000;
      local_208.tv_usec = (__suseconds_t)(this_00->RTO * 1000.0 - (double)local_208.tv_sec);
    }
    local_220 = (_Elt_pointer)
                (ulong)((int)((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_start.
                                            _M_last -
                                     (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur)
                             >> 3) +
                        (int)((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish.
                                            _M_cur -
                                     (long)local_288._M_impl.super__Deque_impl_data._M_finish.
                                           _M_first) >> 3) +
                       ((((uint)((int)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                                (int)local_288._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                         ) - 1) +
                       (uint)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node ==
                             (_Map_pointer)0x0)) * 0x40);
    local_298 = 0;
    pppSVar32 = local_228;
    local_210 = uVar34;
    do {
      while( true ) {
        while( true ) {
          iVar13 = select(local_1e4,&local_1b8,(fd_set *)0x0,(fd_set *)0x0,&local_208);
          if (iVar13 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error in Select",0xf);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            piVar21 = __errno_location();
            pcVar22 = strerror(*piVar21);
            poVar18 = std::operator<<((ostream *)&std::cerr,pcVar22);
            std::endl<char,std::char_traits<char>>(poVar18);
            exit(5);
          }
          if (0 < iVar13) break;
          if (iVar13 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Timeout Event ",0xe);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
            std::ostream::put('`');
            std::ostream::flush();
            if (local_208.tv_usec == 0 && local_208.tv_sec == 0) {
              uVar34 = ((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                       ((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                       ((((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                                 (long)local_288._M_impl.super__Deque_impl_data._M_start._M_node) >>
                         3) - 1) +
                       (ulong)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node ==
                              (_Map_pointer)0x0)) * 0x40;
              if (uVar34 != 0) {
                psVar26 = &clientDetails;
                ppSVar27 = local_b0;
                for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
                  *ppSVar27 = *(Sliding **)psVar26;
                  psVar26 = (sockaddr_storage *)((long)psVar26 + (ulong)bVar35 * -0x10 + 8);
                  ppSVar27 = ppSVar27 + (ulong)bVar35 * -2 + 1;
                }
                pbVar20 = SendUnit::getSendUnit(pSVar16,(byte4)pppSVar32);
                ppSVar27 = local_b0;
                psVar28 = local_130;
                for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
                  *(Sliding **)psVar28 = *ppSVar27;
                  ppSVar27 = ppSVar27 + (ulong)bVar35 * -2 + 1;
                  psVar28 = (sockaddr *)(psVar28[-(ulong)bVar35].sa_data + 6);
                }
                sendto((int)local_218,pbVar20,0x5c0,0,local_130,0x80);
                memset(pbVar20,0,0x5c0);
                free(pbVar20);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Retransmitting : ",0x11);
                poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
                std::ostream::put((char)poVar18);
                std::ostream::flush();
                pppSVar12 = local_288._M_impl.super__Deque_impl_data._M_finish._M_node;
                pppSVar11 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
                ppSVar30 = local_288._M_impl.super__Deque_impl_data._M_start._M_first;
                ppSVar24 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
                local_1d8 = local_288._M_impl.super__Deque_impl_data._M_start._M_last;
                for (pppSVar33 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
                    local_230 = pbVar15, local_228 = pppSVar32, pppSVar33 < pppSVar12;
                    pppSVar33 = pppSVar33 + 1) {
                  operator_delete(pppSVar33[1],0x200);
                  pppSVar32 = local_228;
                  pbVar15 = local_230;
                }
                local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = ppSVar24;
                local_288._M_impl.super__Deque_impl_data._M_finish._M_first = ppSVar30;
                local_288._M_impl.super__Deque_impl_data._M_finish._M_node = pppSVar11;
                local_298 = uVar34;
                local_288._M_impl.super__Deque_impl_data._M_finish._M_last = local_1d8;
              }
              Congestion::slowStart(this_00);
            }
            goto LAB_00103ec8;
          }
        }
        psVar26 = &clientDetails;
        this_01 = (ServerService *)&stack0xfffffffffffffcd8;
        for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
          uVar2._0_2_ = psVar26->ss_family;
          uVar2._2_1_ = psVar26->__ss_padding[0];
          uVar2._3_1_ = psVar26->__ss_padding[1];
          uVar2._4_1_ = psVar26->__ss_padding[2];
          uVar2._5_1_ = psVar26->__ss_padding[3];
          uVar2._6_1_ = psVar26->__ss_padding[4];
          uVar2._7_1_ = psVar26->__ss_padding[5];
          this_01->broadcastFD = (int)uVar2;
          this_01->serverPort = (int)((ulong)uVar2 >> 0x20);
          psVar26 = (sockaddr_storage *)((long)psVar26 + (ulong)bVar35 * -0x10 + 8);
          this_01 = (ServerService *)((long)this_01 + (ulong)bVar35 * -0x10 + 8);
        }
        bVar14 = readAck(this_01,(int)local_218,in_stack_fffffffffffffcd8);
        pppSVar32 = (_Map_pointer)(ulong)bVar14;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ack Event ",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
        if (local_29c < bVar14) break;
        this_00->dupAck = this_00->dupAck + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dup ACK: ",9);
        poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18," ACK Count:",0xb);
        plVar17 = (long *)std::ostream::operator<<(poVar18,this_00->dupAck);
        std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
        std::ostream::put((char)plVar17);
        std::ostream::flush();
        if (2 < this_00->dupAck) {
          psVar26 = &clientDetails;
          ppSVar27 = local_b0;
          for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
            *ppSVar27 = *(Sliding **)psVar26;
            psVar26 = (sockaddr_storage *)((long)psVar26 + (ulong)bVar35 * -0x10 + 8);
            ppSVar27 = ppSVar27 + (ulong)bVar35 * -2 + 1;
          }
          pbVar20 = SendUnit::getSendUnit(pSVar16,bVar14);
          ppSVar27 = local_b0;
          psVar28 = local_130;
          for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
            *(Sliding **)psVar28 = *ppSVar27;
            ppSVar27 = ppSVar27 + (ulong)bVar35 * -2 + 1;
            psVar28 = (sockaddr *)(psVar28[-(ulong)bVar35].sa_data + 6);
          }
          sendto((int)local_218,pbVar20,0x5c0,0,local_130,0x80);
          memset(pbVar20,0,0x5c0);
          free(pbVar20);
          Congestion::updateRTO(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Retransmitting : ",0x11);
          poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
          std::ostream::put((char)poVar18);
          std::ostream::flush();
          lVar23 = ((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                   ((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                   ((((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_288._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                    - 1) + (ulong)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                  (_Map_pointer)0x0)) * 0x40;
          if (((lVar23 != 0) &&
              ((*local_288._M_impl.super__Deque_impl_data._M_start._M_cur)->mark == false)) &&
             (lVar23 = lVar23 + -1, lVar23 != 0)) {
            uVar25 = (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur -
                     (long)local_288._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
            lVar29 = 0;
            ppSVar24 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar34 = uVar25;
            do {
              ppSVar30 = ppSVar24;
              if (0x3f < uVar34) {
                uVar31 = (uVar34 >> 6) + 0xfc00000000000000;
                if (0 < (long)uVar34) {
                  uVar31 = uVar34 >> 6;
                }
                ppSVar30 = local_288._M_impl.super__Deque_impl_data._M_start._M_node[uVar31] +
                           uVar25 + lVar29 + uVar31 * -0x40;
              }
              (*ppSVar30)->mark = true;
              lVar29 = lVar29 + 1;
              ppSVar24 = ppSVar24 + 1;
              uVar34 = uVar34 + 1;
              lVar23 = lVar23 + -1;
            } while (lVar23 != 0);
          }
          Congestion::slowStart(this_00);
          this_00->dupAck = 0;
          local_298 = (ulong)((int)((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_start.
                                                  _M_last -
                                           (long)local_288._M_impl.super__Deque_impl_data._M_start.
                                                 _M_cur) >> 3) +
                              (int)((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish
                                                  ._M_cur -
                                           (long)local_288._M_impl.super__Deque_impl_data._M_finish.
                                                 _M_first) >> 3) +
                             ((((uint)((int)local_288._M_impl.super__Deque_impl_data._M_finish.
                                            _M_node -
                                      (int)local_288._M_impl.super__Deque_impl_data._M_start._M_node
                                      ) >> 3) - 1) +
                             (uint)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                   (_Map_pointer)0x0)) * 0x40);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"New ACK: ",9);
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      if ((((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_288._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x40 != 0) &&
         ((*local_288._M_impl.super__Deque_impl_data._M_start._M_cur)->seqNo <= bVar14 - 0x5b0)) {
        while ((local_288._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_288._M_impl.super__Deque_impl_data._M_start._M_cur &&
               ((pSVar19 = *local_288._M_impl.super__Deque_impl_data._M_start._M_cur,
                pSVar19->seqNo < bVar14 && (pSVar19->mark == false))))) {
          local_228 = (_Map_pointer)pSVar19->sentTime;
          clock_gettime(1,(timespec *)local_130);
          Congestion::updateRTT
                    (this_00,(double)local_228,
                     (double)((long)local_130[0].sa_data._6_8_ / 1000000000 + local_130[0]._0_8_));
          if (local_288._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_288._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_288._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_288._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_288._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_288._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_288._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
            local_288._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_288._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_288._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_288._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_288._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
        }
      }
      local_29c = bVar14;
    } while (((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_288._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 0x40 != 0);
    dVar1 = this_00->ssthresh;
    if ((dVar1 <= this_00->cwnd) && ((dVar1 != -1.0 || (NAN(dVar1))))) {
      this_00->isSlowStart = false;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Entering Congestion Avoidance mode",0x22);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
    }
    if (this_00->isSlowStart == true) {
      Congestion::updateSlowStart(this_00);
    }
    else {
      Congestion::updateCongestionAvoidance(this_00);
    }
    local_298._0_4_ = 0;
LAB_00103ec8:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Percentage of Packets Sent: ",0x1c);
    local_298._0_4_ = (int)local_220 - (int)local_298;
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_298);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"/",1);
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," = ",3);
    poVar18 = std::ostream::_M_insert<double>
                        ((double)(((float)(int)local_298 / (float)(int)local_220) * 100.0));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    if ((pSVar16->dataSize < (ulong)(uint)((int)local_210 - (int)local_1f8)) ||
       (pSVar16->dataSize < (ulong)(uint)((int)pppSVar32 - (int)local_1f8))) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      poVar18 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,"Last Packet has been delivered & All ACKs have been received",0x3c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      memset(pbVar15,0,0x5c0);
      operator_delete(pSVar16,0x20);
      std::_Deque_base<Sliding_*,_std::allocator<Sliding_*>_>::~_Deque_base(&local_288);
      return true;
    }
  } while( true );
}

Assistant:

bool
ServerService::sendSegments(byte *data, int socketFD, struct sockaddr_storage clientDetails, int recvWindowSize) {

    byte4 initSeqNo = rand() % 100;
    byte4 seqNo = initSeqNo;
    byte4 sendBase = initSeqNo;

    byte *buffer = (byte *) calloc(MTU, sizeof(byte));
    memset(buffer, 0, MTU);

    //使用序号获取 udp
    auto *sendUnit = new SendUnit(initSeqNo, data);

    auto *congestion = new Congestion(recvWindowSize);

    // 丢包数
    int packetDropped = 0;
    //数据分段数量
    int packetNumber = (int) (sendUnit->dataSize / (MTU - HEADER_LEN)) + 1;

    fd_set readFDs; // fd_set 来存储文件描述符, 用于使用多个套接字时不阻塞线程
    FD_ZERO(&readFDs); //FD_ZERO宏将一个 fd_set 类型变量的所有位都设为 0
    FD_SET(socketFD, &readFDs);
    int nextFD = socketFD + 1;

    byte4 ackNo;

    struct timeval timeValue;
    timeValue.tv_sec = 0; //秒
    timeValue.tv_usec = INIT_SEC; //微秒

    //双端队列实现滑动窗口
    deque<Sliding *> window;
    window.clear();
    int readyDescriptors; // -1 -> Error
    int sendDataNum; // 单次需要发送数据段数量
    int SlideWindowDataNum = 0;
    int left = 0;

    while (true) {
        sendDataNum = (int) min(congestion->cwnd, (double) recvWindowSize);
        if (congestion->isSlowStart) {
            cout << "Sending Packets in mode: Slow Start" << endl;
            cout << "Maximum Packets that will be sent:" << sendDataNum << endl;
        } else {
            cout << "Sending Packets in mode: Congestion Avoidance" << endl;
            cout << "Maximum Packets that will be sent:" << sendDataNum << endl;
        }

        cout << "RetransmissionTime-Out: " << congestion->RTO << endl;
        window.clear();

        //向滑动窗格填充数据
        while (sendDataNum != 0 && (seqNo - initSeqNo) < sendUnit->dataSize) {
            buffer = sendUnit->getSendUnit(seqNo);
            sendResponse(socketFD, buffer, clientDetails);
            window.push_back(new Sliding(sendUnit->getRUDP(seqNo), getTime()));
            seqNo += (MTU - HEADER_LEN);
            sendDataNum--;
        }
        //获取滑动窗格分组数
        SlideWindowDataNum = (int) window.size();

        FD_ZERO(&readFDs);
        FD_SET(socketFD, &readFDs);
        if (timeValue.tv_usec != 0 && timeValue.tv_sec != 0) {
            timeValue.tv_sec = (long) congestion->RTO / NANO_SEC;
            timeValue.tv_usec = (congestion->RTO) * 1000 - timeValue.tv_sec;
        }

        while (true) {
            readyDescriptors = select(nextFD, &readFDs, NULL, NULL, &timeValue);
            if (readyDescriptors == -1) {
                cout << "Error in Select" << endl;
                cerr << strerror(errno) << endl;
                exit(5);
            } else if (readyDescriptors > 0) {
                // ACK 判断
                ackNo = readAck(socketFD, clientDetails);
                cout << "Ack Event " << endl;
                if (sendBase < ackNo) {
                    // 创建新 ACK
                    cout << "New ACK: " << ackNo << endl;
                    sendBase = ackNo;
                    if (window.size() > 0 && sendBase - (MTU - HEADER_LEN) >= window.front()->seqNo) {
                        while (!window.empty()) {
                            if (window.front()->seqNo < sendBase && window.front()->mark == false) {
                                congestion->updateRTT(window.front()->sentTime, getTime());
                                window.pop_front();
                            } else {
                                break;
                            }
                        }
                    }
                    if (window.size() == 0) {
                        left = 0;
                        if (congestion->cwnd >= congestion->ssthresh && congestion->ssthresh != -1) {
                            congestion->isSlowStart = false; // congestion avoidance
                            cout << "Entering Congestion Avoidance mode" << endl;
                        }
                        if (congestion->isSlowStart) {
                            congestion->updateSlowStart();
                        } else {
                            congestion->updateCongestionAvoidance();
                        }
                        break;
                    }
                } else {
                    // 重复的 ACK 确认
                    congestion->dupAck++;
                    cout << "Dup ACK: " << ackNo << " ACK Count:" << congestion->dupAck << endl;
                    if (congestion->dupAck >= 3) {
                        // 三次收到重复 ACK 后立即重传
                        retransmit(ackNo, socketFD, clientDetails, sendUnit);
                        congestion->updateRTO();
                        packetDropped++;
                        cout << "Retransmitting : " << ackNo << endl;
                        if (window.size() != 0) {
                            if (!window.front()->mark) {
                                for (int i = 0; i < window.size() - 1; i++) {
                                    window[i]->mark = true;
                                }
                            }
                        }
                        congestion->slowStart();
                        congestion->dupAck = 0;
                        left = window.size();
                    }
                }
            } else if (readyDescriptors == 0) {
                // 超时
                cout << "Timeout Event " << endl;
                if (timeValue.tv_sec == 0 && timeValue.tv_usec == 0) {
                    // Loss occurred go back to slow start
                    packetDropped += window.size();
                    if (window.size() != 0) {
                        left = window.size();
                        retransmit(ackNo, socketFD, clientDetails, sendUnit);
                        cout << "Retransmitting : " << window.front()->seqNo << endl;
                        window.clear();
                    }
                    congestion->slowStart();
                }
                break;
            }
        }

        cout << "Percentage of Packets Sent: " << SlideWindowDataNum - left << "/" << SlideWindowDataNum << " = "
             << ((float) (SlideWindowDataNum - left) / SlideWindowDataNum) * 100 << endl;
        SlideWindowDataNum = 0, left = 0;
        if ((seqNo - initSeqNo) > sendUnit->dataSize || (ackNo - initSeqNo) > sendUnit->dataSize) {
            cout << endl << "Last Packet has been delivered & All ACKs have been received" << endl;
            break;
        }
    }

    memset(buffer, 0, MTU);
    delete sendUnit;
    return true;
}